

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O3

void ZSTD_setBasePrices(optState_t *optPtr,int optLevel)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  U32 UVar4;
  
  if (optPtr->literalCompressionMode != ZSTD_ps_disable) {
    uVar3 = optPtr->litSum + 1;
    if (optLevel == 0) {
      if (uVar3 == 0) goto LAB_00206d5c;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      UVar4 = iVar2 << 8;
    }
    else {
      if (uVar3 == 0) goto LAB_00206d5c;
      uVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      if (0x16 < uVar1) goto LAB_00206d7b;
      UVar4 = (uVar3 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
    }
    optPtr->litSumBasePrice = UVar4;
  }
  uVar3 = optPtr->litLengthSum + 1;
  if (optLevel == 0) {
    if (uVar3 != 0) {
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      optPtr->litLengthSumBasePrice = iVar2 << 8;
      uVar3 = optPtr->matchLengthSum + 1;
      if (uVar3 != 0) {
        iVar2 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        optPtr->matchLengthSumBasePrice = iVar2 << 8;
        uVar3 = optPtr->offCodeSum + 1;
        if (uVar3 != 0) {
          iVar2 = 0x1f;
          if (uVar3 != 0) {
            for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
            }
          }
          UVar4 = iVar2 << 8;
LAB_00206d57:
          optPtr->offCodeSumBasePrice = UVar4;
          return;
        }
      }
    }
  }
  else if (uVar3 != 0) {
    uVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    if (uVar1 < 0x17) {
      optPtr->litLengthSumBasePrice = (uVar3 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
      uVar3 = optPtr->matchLengthSum + 1;
      if (uVar3 == 0) goto LAB_00206d5c;
      uVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      if (uVar1 < 0x17) {
        optPtr->matchLengthSumBasePrice = (uVar3 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
        uVar3 = optPtr->offCodeSum + 1;
        if (uVar3 == 0) goto LAB_00206d5c;
        uVar1 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
          }
        }
        if (uVar1 < 0x17) {
          UVar4 = (uVar3 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
          goto LAB_00206d57;
        }
      }
    }
LAB_00206d7b:
    __assert_fail("hb + BITCOST_ACCURACY < 31",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x3c,"U32 ZSTD_fracWeight(U32)");
  }
LAB_00206d5c:
  __assert_fail("val != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                ,0xab,"unsigned int ZSTD_highbit32(U32)");
}

Assistant:

static void ZSTD_setBasePrices(optState_t* optPtr, int optLevel)
{
    if (ZSTD_compressedLiterals(optPtr))
        optPtr->litSumBasePrice = WEIGHT(optPtr->litSum, optLevel);
    optPtr->litLengthSumBasePrice = WEIGHT(optPtr->litLengthSum, optLevel);
    optPtr->matchLengthSumBasePrice = WEIGHT(optPtr->matchLengthSum, optLevel);
    optPtr->offCodeSumBasePrice = WEIGHT(optPtr->offCodeSum, optLevel);
}